

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O0

void asio::detail::
     completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  handler;
  handler_work<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_asio::system_executor>
  w;
  ptr p;
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  *h;
  undefined4 in_stack_ffffffffffffff78;
  half_t in_stack_ffffffffffffff7c;
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  *in_stack_ffffffffffffff80;
  std_fenced_block *in_stack_ffffffffffffff88;
  ptr *in_stack_ffffffffffffffa0;
  handler_work<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_asio::system_executor>
  local_41;
  undefined1 *local_40;
  long local_8;
  
  local_40 = (undefined1 *)(in_RSI + 0x18);
  local_8 = in_RDI;
  handler_work<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_asio::system_executor>
  ::handler_work(&local_41,
                 (wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
                  *)(in_RSI + 0x18));
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  ::wrapped_handler(in_stack_ffffffffffffff80,
                    (wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_40 = &stack0xffffffffffffff88;
  ptr::reset(in_stack_ffffffffffffffa0);
  if (local_8 != 0) {
    std_fenced_block::std_fenced_block
              ((std_fenced_block *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    handler_work<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>,asio::system_executor>
    ::
    complete<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>>
              ((handler_work<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_asio::system_executor>
                *)in_stack_ffffffffffffff80,
               (wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
                *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
                *)0x2cf063);
    std_fenced_block::~std_fenced_block(in_stack_ffffffffffffff88);
  }
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  ::~wrapped_handler(in_stack_ffffffffffffff80);
  handler_work<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_asio::system_executor>
  ::~handler_work(&local_41);
  ptr::~ptr((ptr *)0x2cf0c9);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }